

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

FuncDef * sqlite3FindFunction(sqlite3 *db,char *zName,int nArg,u8 enc,u8 createFlag)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  HashElem *pHVar6;
  FuncDef *pFVar7;
  FuncDef *pFVar8;
  byte *pbVar9;
  int iVar10;
  bool bVar11;
  
  if (zName == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    sVar5 = strlen(zName);
    uVar2 = (uint)sVar5 & 0x3fffffff;
  }
  iVar10 = 0;
  pHVar6 = findElementWithHash(&db->aFunc,zName,(uint *)0x0);
  pFVar7 = (FuncDef *)pHVar6->data;
  if (pFVar7 == (FuncDef *)0x0) {
    pFVar8 = (FuncDef *)0x0;
    iVar10 = 0;
    if (createFlag == '\0') goto LAB_0012d295;
LAB_0012d2fc:
    bVar11 = createFlag != '\0';
    if ((bVar11) && (iVar10 < 6)) {
      pFVar7 = (FuncDef *)sqlite3DbMallocZero(db,(ulong)(uVar2 + 0x49));
      if (pFVar7 == (FuncDef *)0x0) {
        return (FuncDef *)0x0;
      }
      pFVar8 = pFVar7 + 1;
      pFVar7->zName = (char *)pFVar8;
      pFVar7->nArg = (i16)nArg;
      pFVar7->funcFlags = (uint)enc;
      memcpy(pFVar8,zName,(ulong)(uVar2 + 1));
      bVar1 = (byte)pFVar7[1].nArg;
      if (bVar1 != 0) {
        pbVar9 = (byte *)((long)&pFVar7[1].nArg + 1);
        do {
          pbVar9[-1] = ""[bVar1];
          bVar1 = *pbVar9;
          pbVar9 = pbVar9 + 1;
        } while (bVar1 != 0);
        pFVar8 = (FuncDef *)pFVar7->zName;
      }
      pFVar8 = (FuncDef *)sqlite3HashInsert(&db->aFunc,(char *)pFVar8,pFVar7);
      if (pFVar8 == pFVar7) {
        sqlite3DbFreeNN(db,pFVar7);
        sqlite3OomFault(db);
        return (FuncDef *)0x0;
      }
      pFVar7->pNext = pFVar8;
      return pFVar7;
    }
  }
  else {
    pFVar8 = (FuncDef *)0x0;
    do {
      iVar3 = matchQuality(pFVar7,nArg,enc);
      if (iVar10 < iVar3) {
        iVar10 = iVar3;
        pFVar8 = pFVar7;
      }
      pFVar7 = pFVar7->pNext;
    } while (pFVar7 != (FuncDef *)0x0);
    if (createFlag != '\0') goto LAB_0012d2fc;
    if (pFVar8 == (FuncDef *)0x0) {
      pFVar8 = (FuncDef *)0x0;
    }
    else if ((db->mDbFlags & 2) == 0) {
      bVar11 = false;
      goto LAB_0012d3a4;
    }
LAB_0012d295:
    uVar4 = ""[(byte)*zName] + uVar2;
    pFVar7 = sqlite3FunctionSearch(uVar4 / 0x17 + (uVar4 / 0x17) * -0x18 + uVar4,zName);
    iVar10 = 0;
    if (pFVar7 != (FuncDef *)0x0) {
      do {
        iVar3 = matchQuality(pFVar7,nArg,enc);
        if (iVar10 < iVar3) {
          iVar10 = iVar3;
          pFVar8 = pFVar7;
        }
        pFVar7 = pFVar7->pNext;
      } while (pFVar7 != (FuncDef *)0x0);
      goto LAB_0012d2fc;
    }
    bVar11 = false;
  }
  if (pFVar8 == (FuncDef *)0x0) {
    return (FuncDef *)0x0;
  }
LAB_0012d3a4:
  if (bVar11) {
    return pFVar8;
  }
  if (pFVar8->xSFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
    return (FuncDef *)0x0;
  }
  return pFVar8;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FindFunction(
  sqlite3 *db,       /* An open database */
  const char *zName, /* Name of the function.  zero-terminated */
  int nArg,          /* Number of arguments.  -1 means any number */
  u8 enc,            /* Preferred text encoding */
  u8 createFlag      /* Create new entry if true and does not otherwise exist */
){
  FuncDef *p;         /* Iterator variable */
  FuncDef *pBest = 0; /* Best match found so far */
  int bestScore = 0;  /* Score of best match */
  int h;              /* Hash value */
  int nName;          /* Length of the name */

  assert( nArg>=(-2) );
  assert( nArg>=(-1) || createFlag==0 );
  nName = sqlite3Strlen30(zName);

  /* First search for a match amongst the application-defined functions.
  */
  p = (FuncDef*)sqlite3HashFind(&db->aFunc, zName);
  while( p ){
    int score = matchQuality(p, nArg, enc);
    if( score>bestScore ){
      pBest = p;
      bestScore = score;
    }
    p = p->pNext;
  }

  /* If no match is found, search the built-in functions.
  **
  ** If the DBFLAG_PreferBuiltin flag is set, then search the built-in
  ** functions even if a prior app-defined function was found.  And give
  ** priority to built-in functions.
  **
  ** Except, if createFlag is true, that means that we are trying to
  ** install a new function.  Whatever FuncDef structure is returned it will
  ** have fields overwritten with new information appropriate for the
  ** new function.  But the FuncDefs for built-in functions are read-only.
  ** So we must not search for built-ins when creating a new function.
  */
  if( !createFlag && (pBest==0 || (db->mDbFlags & DBFLAG_PreferBuiltin)!=0) ){
    bestScore = 0;
    h = SQLITE_FUNC_HASH(sqlite3UpperToLower[(u8)zName[0]], nName);
    p = sqlite3FunctionSearch(h, zName);
    while( p ){
      int score = matchQuality(p, nArg, enc);
      if( score>bestScore ){
        pBest = p;
        bestScore = score;
      }
      p = p->pNext;
    }
  }

  /* If the createFlag parameter is true and the search did not reveal an
  ** exact match for the name, number of arguments and encoding, then add a
  ** new entry to the hash table and return it.
  */
  if( createFlag && bestScore<FUNC_PERFECT_MATCH &&
      (pBest = sqlite3DbMallocZero(db, sizeof(*pBest)+nName+1))!=0 ){
    FuncDef *pOther;
    u8 *z;
    pBest->zName = (const char*)&pBest[1];
    pBest->nArg = (u16)nArg;
    pBest->funcFlags = enc;
    memcpy((char*)&pBest[1], zName, nName+1);
    for(z=(u8*)pBest->zName; *z; z++) *z = sqlite3UpperToLower[*z];
    pOther = (FuncDef*)sqlite3HashInsert(&db->aFunc, pBest->zName, pBest);
    if( pOther==pBest ){
      sqlite3DbFree(db, pBest);
      sqlite3OomFault(db);
      return 0;
    }else{
      pBest->pNext = pOther;
    }
  }

  if( pBest && (pBest->xSFunc || createFlag) ){
    return pBest;
  }
  return 0;
}